

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5PorterCreate(void *pCtx,char **azArg,int nArg,Fts5Tokenizer **ppOut)

{
  undefined8 *in_RCX;
  int in_EDX;
  undefined8 *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  char **az2;
  int nArg2;
  char *zBase;
  PorterTokenizer *pRet;
  int rc;
  fts5_api *pApi;
  fts5_tokenizer_v2 *pV2;
  void *pUserdata;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined8 *local_78;
  int local_6c;
  char *local_58;
  undefined8 *local_50;
  int local_44;
  undefined8 *local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0;
  local_58 = "unicode61";
  local_18 = (undefined8 *)0x0;
  if (0 < in_EDX) {
    local_58 = (char *)*in_RSI;
  }
  local_50 = (undefined8 *)sqlite3_malloc(in_stack_ffffffffffffff7c);
  if (local_50 == (undefined8 *)0x0) {
    local_44 = 7;
  }
  else {
    memset(local_50,0,0xa8);
    local_44 = (**(code **)(in_RDI + 0x28))(in_RDI,local_58,&local_10,&local_18);
  }
  if (local_44 == 0) {
    if (in_EDX < 1) {
      local_6c = 0;
    }
    else {
      local_6c = in_EDX + -1;
    }
    if (local_6c == 0) {
      local_78 = (undefined8 *)0x0;
    }
    else {
      local_78 = in_RSI + 1;
    }
    *local_50 = *local_18;
    local_50[1] = local_18[1];
    local_50[2] = local_18[2];
    local_50[3] = local_18[3];
    local_44 = (*(code *)local_50[1])(local_10,local_78,local_6c,local_50 + 4);
  }
  if (local_44 != 0) {
    fts5PorterDelete((Fts5Tokenizer *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
    ;
    local_50 = (undefined8 *)0x0;
  }
  *in_RCX = local_50;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_44;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5PorterCreate(
  void *pCtx,
  const char **azArg, int nArg,
  Fts5Tokenizer **ppOut
){
  fts5_api *pApi = (fts5_api*)pCtx;
  int rc = SQLITE_OK;
  PorterTokenizer *pRet;
  void *pUserdata = 0;
  const char *zBase = "unicode61";
  fts5_tokenizer_v2 *pV2 = 0;

  if( nArg>0 ){
    zBase = azArg[0];
  }

  pRet = (PorterTokenizer*)sqlite3_malloc(sizeof(PorterTokenizer));
  if( pRet ){
    memset(pRet, 0, sizeof(PorterTokenizer));
    rc = pApi->xFindTokenizer_v2(pApi, zBase, &pUserdata, &pV2);
  }else{
    rc = SQLITE_NOMEM;
  }
  if( rc==SQLITE_OK ){
    int nArg2 = (nArg>0 ? nArg-1 : 0);
    const char **az2 = (nArg2 ? &azArg[1] : 0);
    memcpy(&pRet->tokenizer_v2, pV2, sizeof(fts5_tokenizer_v2));
    rc = pRet->tokenizer_v2.xCreate(pUserdata, az2, nArg2, &pRet->pTokenizer);
  }

  if( rc!=SQLITE_OK ){
    fts5PorterDelete((Fts5Tokenizer*)pRet);
    pRet = 0;
  }
  *ppOut = (Fts5Tokenizer*)pRet;
  return rc;
}